

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

int __thiscall MIDIStreamer::ServiceEvent(MIDIStreamer *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if ((this->EndQueued != 2) &&
     (iVar1 = (*this->MIDI->_vptr_MIDIDevice[0xd])(this->MIDI,this->Buffer + this->BufferNum),
     iVar1 == 0)) {
    while( true ) {
      if (this->EndQueued == 1) {
        uVar2 = FillStopBuffer(this,this->BufferNum);
        if ((uVar2 & 3) != 2) {
          this->EndQueued = 2;
        }
      }
      else {
        uVar2 = FillBuffer(this,this->BufferNum,0x80,100000);
      }
      if ((uVar2 & 3) != 1) {
        if ((uVar2 & 3) != 0) {
          return (int)uVar2 >> 2;
        }
        iVar1 = (*this->MIDI->_vptr_MIDIDevice[0x10])();
        if (((char)iVar1 != '\0') &&
           (iVar1 = (*this->MIDI->_vptr_MIDIDevice[9])(this->MIDI,this->Buffer + this->BufferNum),
           iVar1 != 0)) {
          return iVar1;
        }
        iVar1 = (*this->MIDI->_vptr_MIDIDevice[0x10])();
        if (((char)iVar1 == '\0') &&
           (iVar1 = (*this->MIDI->_vptr_MIDIDevice[8])(this->MIDI,this->Buffer + this->BufferNum),
           iVar1 != 0)) {
          return iVar1;
        }
        *(byte *)&this->BufferNum = (byte)this->BufferNum ^ 1;
        return 0;
      }
      if ((this->super_MusInfo).m_Looping != true) break;
      this->Restarting = true;
    }
    this->EndQueued = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MIDIStreamer::ServiceEvent()
{
	int res;

	if (EndQueued == 2)
	{
		return 0;
	}
	if (0 != (res = MIDI->UnprepareHeader(&Buffer[BufferNum])))
	{
		return res;
	}
fill:
	if (EndQueued == 1)
	{
		res = FillStopBuffer(BufferNum);
		if ((res & 3) != SONG_ERROR)
		{
			EndQueued = 2;
		}
	}
	else
	{
		res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
	}
	switch (res & 3)
	{
	case SONG_MORE:
		if ((MIDI->NeedThreadedCallback() && 0 != (res = MIDI->StreamOutSync(&Buffer[BufferNum]))) ||
			(!MIDI->NeedThreadedCallback() && 0 != (res = MIDI->StreamOut(&Buffer[BufferNum]))))
		{
			return res;
		}
		else
		{
			BufferNum ^= 1;
		}
		break;

	case SONG_DONE:
		if (m_Looping)
		{
			Restarting = true;
			goto fill;
		}
		EndQueued = 1;
		break;

	default:
		return res >> 2;
	}
	return 0;
}